

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_24::BinaryReader::ReadMemLocation
          (BinaryReader *this,Address *alignment_log2,Index *memidx,Address *offset,char *desc_align
          ,char *desc_memidx,char *desc_offset,uint8_t *lane_val)

{
  bool bVar1;
  Result RVar2;
  char *desc_memidx_local;
  char *desc_align_local;
  Address *offset_local;
  Index *memidx_local;
  Address *alignment_log2_local;
  BinaryReader *this_local;
  
  RVar2 = ReadAlignment(this,alignment_log2,desc_align);
  bVar1 = Failed(RVar2);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
    return (Result)this_local._4_4_;
  }
  *memidx = 0;
  if (*alignment_log2 >> 6 != 0) {
    bVar1 = Features::multi_memory_enabled(&this->options_->features);
    if (!bVar1) {
      PrintError(this,"multi_memory not allowed");
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    *alignment_log2 = *alignment_log2 & 0x3f;
    RVar2 = ReadMemidx(this,memidx,desc_memidx);
    bVar1 = Failed(RVar2);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
  }
  RVar2 = ReadAddress(this,offset,0,desc_offset);
  bVar1 = Failed(RVar2);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    if (lane_val != (uint8_t *)0x0) {
      RVar2 = ReadU8(this,lane_val,"Lane idx");
      bVar1 = Failed(RVar2);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        return (Result)this_local._4_4_;
      }
    }
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReader::ReadMemLocation(Address* alignment_log2,
                                     Index* memidx,
                                     Address* offset,
                                     const char* desc_align,
                                     const char* desc_memidx,
                                     const char* desc_offset,
                                     uint8_t* lane_val) {
  CHECK_RESULT(ReadAlignment(alignment_log2, desc_align));
  *memidx = 0;
  if (*alignment_log2 >> 6) {
    ERROR_IF(!options_.features.multi_memory_enabled(),
             "multi_memory not allowed");
    *alignment_log2 = *alignment_log2 & ((1 << 6) - 1);
    CHECK_RESULT(ReadMemidx(memidx, desc_memidx));
  }
  CHECK_RESULT(ReadAddress(offset, 0, desc_offset));

  if (lane_val) {
    CHECK_RESULT(ReadU8(lane_val, "Lane idx"));
  }

  return Result::Ok;
}